

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  char *lhss;
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  string sStack_1d8;
  cmListFileBacktrace local_1b8;
  ostringstream msg;
  
  lhss = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersion_abi_cxx11_();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,_msg);
  std::__cxx11::string::~string((string *)&msg);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar3 = std::operator<<((ostream *)&msg,"The detected version of Ninja (");
    std::operator<<(poVar3,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)&msg,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&msg,(string *)&sStack_1d8);
    std::operator<<(poVar3,").");
    std::__cxx11::string::~string((string *)&sStack_1d8);
    this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmListFileBacktrace::cmListFileBacktrace(&local_1b8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&sStack_1d8,&local_1b8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1b8);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    OpenBuildFileStream(this);
    OpenRulesFileStream(this);
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
    ::clear(&(this->TargetDependsClosures)._M_t);
    InitOutputPathPrefix(this);
    std::__cxx11::string::string((string *)&sStack_1d8,"all",(allocator *)&local_1b8);
    NinjaOutputPath((string *)&msg,this,&sStack_1d8);
    std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::string::string((string *)&sStack_1d8,"CMakeCache.txt",(allocator *)&local_1b8);
    NinjaOutputPath((string *)&msg,this,&sStack_1d8);
    std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    PVar2 = cmMakefile::GetPolicyStatus
                      ((*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                         LocalGenerators.
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Makefile,CMP0058);
    this->PolicyCMP0058 = PVar2;
    this->ComputingUnknownDependencies = PVar2 < NEW;
    cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
    WriteAssumedSourceDependencies(this);
    WriteTargetAliases(this,(ostream *)this->BuildFileStream);
    WriteFolderTargets(this,(ostream *)this->BuildFileStream);
    WriteUnknownExplicitDependencies(this,(ostream *)this->BuildFileStream);
    WriteBuiltinTargets(this,(ostream *)this->BuildFileStream);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      std::ios::setstate((int)this->RulesFileStream +
                         (int)(this->RulesFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
      std::ios::setstate((int)this->BuildFileStream +
                         (int)(this->BuildFileStream->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                              [-3]);
    }
    CloseCompileCommandsStream(this);
    CloseRulesFileStream(this);
    CloseBuildFileStream(this);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << this->RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, msg.str());
    return;
  }
  this->OpenBuildFileStream();
  this->OpenRulesFileStream();

  this->TargetDependsClosures.clear();

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteFolderTargets(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    this->BuildFileStream->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}